

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

bool RigidBodyDynamics::Math::SpatialMatrixCompareEpsilon
               (SpatialMatrix *matrix_a,SpatialMatrix *matrix_b,Scalar epsilon)

{
  double *pdVar1;
  ostream *poVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar4 = 0;
  bVar6 = false;
  pdVar1 = (double *)matrix_b;
  pdVar3 = (double *)matrix_a;
  do {
    lVar5 = 0;
    do {
      if (epsilon <= ABS(*(double *)((long)pdVar3 + lVar5) - *(double *)((long)pdVar1 + lVar5))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected:",9);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
        std::ostream::put(-0x78);
        poVar2 = (ostream *)std::ostream::flush();
        poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                                          matrix_a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"but was",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                                          matrix_b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        return bVar6;
      }
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x120);
    bVar6 = 4 < uVar4;
    uVar4 = uVar4 + 1;
    pdVar3 = pdVar3 + 1;
    pdVar1 = pdVar1 + 1;
  } while (uVar4 != 6);
  return bVar6;
}

Assistant:

RBDL_DLLAPI bool SpatialMatrixCompareEpsilon (
    const SpatialMatrix &matrix_a, 
    const SpatialMatrix &matrix_b, 
    Scalar epsilon) {
  assert (epsilon >= Scalar(0.));
  unsigned int i, j;

  for (i = 0; i < 6; i++) {
    for (j = 0; j < 6; j++) {
      if (Scalar(fabs(matrix_a(i,j) - matrix_b(i,j))) >= Scalar(epsilon)) {
        std::cerr << "Expected:" 
          << std::endl << matrix_a << std::endl
          << "but was" << std::endl 
          << matrix_b << std::endl;
        return false;
      }
    }
  }

  return true;
}